

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# converters.cpp
# Opt level: O3

converters * __thiscall
pobr::imgProcessing::utils::converters::grayscaleImage(converters *this,Mat *img)

{
  _Any_data local_30;
  code *local_20;
  code *local_18;
  
  cv::Mat::clone();
  local_18 = std::
             _Function_handler<void_(const_unsigned_long_&,_const_unsigned_long_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mdziekon[P]eiti-pobr-logo-recognition/src/img-processing/utils/converters.cpp:65:9)>
             ::_M_invoke;
  local_20 = std::
             _Function_handler<void_(const_unsigned_long_&,_const_unsigned_long_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mdziekon[P]eiti-pobr-logo-recognition/src/img-processing/utils/converters.cpp:65:9)>
             ::_M_manager;
  local_30._M_unused._0_8_ = (undefined8)img;
  local_30._8_8_ = this;
  matrixOps::forEachPixel
            (img,(function<void_(const_unsigned_long_&,_const_unsigned_long_&)> *)&local_30);
  if (local_20 != (code *)0x0) {
    (*local_20)(&local_30,&local_30,__destroy_functor);
  }
  return this;
}

Assistant:

cv::Mat
converters::grayscaleImage(const cv::Mat& img)
{
    auto resultImg = img.clone();

    matrixOps::forEachPixel(
        img,
        [&](const uint64_t& x, const uint64_t& y) -> void
        {
            auto& thisPixel = img.at<cv::Vec3b>(y, x);

            uint8_t value = (thisPixel[0] + thisPixel[1] + thisPixel[2]) / 3;

            resultImg.at<cv::Vec3b>(y, x)[0] = value;
            resultImg.at<cv::Vec3b>(y, x)[1] = value;
            resultImg.at<cv::Vec3b>(y, x)[2] = value;
        }
    );

    return resultImg;
}